

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecs.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FastPForLib::IntegerCODEC::compress
          (IntegerCODEC *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *data)

{
  const_reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  undefined8 *in_RSI;
  allocator_type *in_RDI;
  size_t memavailable;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *compresseddata;
  allocator_type *this_00;
  size_type local_38 [3];
  undefined1 local_19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x121c15);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)in_RSI,in_RDI
            );
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x121c35);
  local_38[0] = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_18,0);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,0);
  (**(code **)*in_RSI)(in_RSI,pvVar1,sVar2,pvVar3,local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)in_RSI);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

virtual std::vector<uint32_t> compress(const std::vector<uint32_t> &data) {
    std::vector<uint32_t> compresseddata(data.size() * 2 +
                                         1024); // allocate plenty of memory
    size_t memavailable = compresseddata.size();
    encodeArray(&data[0], data.size(), &compresseddata[0], memavailable);
    compresseddata.resize(memavailable);
    return compresseddata;
  }